

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlineprops.cpp
# Opt level: O3

void test_cap_styles(Am_Drawonable *d)

{
  int iVar1;
  long lVar2;
  undefined1 *puVar3;
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  
  (**(code **)(*(long *)d + 0x130))(d,&black,&white,0x10,6,8,8,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&white,0x60,6,8,8,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x140))(d,&not_last,0x14,10,100,10,0);
  (**(code **)(*(long *)d + 0x130))(d,&black,&white,0x10,0x15,8,8,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&white,0x60,0x15,8,8,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x140))(d,&black,0x14,0x19,100,0x19,0);
  Am_Style::Am_Style(local_38,(Am_Style *)&butt);
  Am_Style::Am_Style(local_40,(Am_Style *)&round_ls);
  Am_Style::Am_Style(local_48,(Am_Style *)&projecting);
  Am_Style::Am_Style(local_50,(Am_Style *)&Am_No_Style);
  set_style_array(local_38,local_40,local_48,local_50);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_40);
  Am_Style::~Am_Style(local_38);
  lVar2 = -0x78;
  puVar3 = style_array;
  do {
    iVar1 = (int)lVar2 + 0xaa;
    (**(code **)(*(long *)d + 0x140))(d,puVar3,0x14,iVar1,100,iVar1,0);
    (**(code **)(*(long *)d + 0x140))(d,&white,0x14,iVar1,100,iVar1,0);
    iVar1 = (int)lVar2 + 0xa6;
    (**(code **)(*(long *)d + 0x130))(d,&black,&white,0x10,iVar1,8,8,0,0x168,0,1);
    (**(code **)(*(long *)d + 0x130))(d,&black,&white,0x60,iVar1,8,8,0,0x168,0,1);
    puVar3 = puVar3 + 8;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  return;
}

Assistant:

void
test_cap_styles(Am_Drawonable *d)
{
  // A line whose last endpoint is not drawn by virtue of the not_last flag
  d->Draw_Arc(black, white, 16, 6, 8, 8, 0, 360);
  d->Draw_Arc(black, white, 96, 6, 8, 8, 0, 360);
  d->Draw_Line(not_last, 20, 10, 100, 10);

  // A line for comparing the not_last line against (use xmag)
  d->Draw_Arc(black, white, 16, 21, 8, 8, 0, 360);
  d->Draw_Arc(black, white, 96, 21, 8, 8, 0, 360);
  d->Draw_Line(black, 20, 25, 100, 25);

  // Draw three thick lines, each with different cap styles
  int n, y;
  set_style_array(butt, round_ls, projecting);
  for (n = 0; n <= 2; n++) {
    y = 50 + (40 * n);
    d->Draw_Line(style_array[n], 20, y, 100, y);
    d->Draw_Line(white, 20, y, 100, y);
    d->Draw_Arc(black, white, 16, y - 4, 8, 8, 0, 360);
    d->Draw_Arc(black, white, 96, y - 4, 8, 8, 0, 360);
  }
}